

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O2

KeyValues * __thiscall KV::KeyValues::createKey(KeyValues *this,string_view *name)

{
  KeyValues *pKVar1;
  iterator iVar2;
  allocator<char> local_61;
  __uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  char local_48 [8];
  undefined8 uStack_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>
  local_38;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,name,&local_61);
  std::make_unique<KV::KeyValues>();
  local_38.first._M_string_length = local_50;
  local_38.first._M_dataplus._M_p = (pointer)&local_38.first.field_2;
  if (local_58 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48) {
    local_38.first.field_2._8_8_ = uStack_40;
  }
  else {
    local_38.first._M_dataplus._M_p = (pointer)local_58;
  }
  local_50 = 0;
  local_48[0] = '\0';
  local_38.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
  _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
  super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl =
       (__uniq_ptr_data<KV::KeyValues,_std::default_delete<KV::KeyValues>,_true,_true>)
       (__uniq_ptr_data<KV::KeyValues,_std::default_delete<KV::KeyValues>,_true,_true>)
       local_60._M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
       super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl;
  local_60._M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
  super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl =
       (tuple<KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>)
       (_Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>)0x0;
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_48;
  iVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>,KV::KeyValues::kvCompare,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>>
          ::
          _M_emplace_equal<std::pair<std::__cxx11::string,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>,KV::KeyValues::kvCompare,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>>
                      *)&this->keyvalues,&local_38);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>
  ::~pair(&local_38);
  std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::~unique_ptr
            ((unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_> *)&local_60);
  std::__cxx11::string::~string((string *)&local_58);
  pKVar1 = *(KeyValues **)(iVar2._M_node + 2);
  pKVar1->key = (string *)(iVar2._M_node + 1);
  pKVar1->parentKV = this;
  if (this->parentKV != (KeyValues *)0x0) {
    pKVar1->depth = this->depth + 1;
  }
  return pKVar1;
}

Assistant:

KeyValues &KeyValues::createKey( const std::string_view &name )
	{
		auto it = keyvalues.insert( std::make_pair( std::string( name ), std::make_unique< KeyValues >() ) );
		KeyValues &kv = *it->second;
		kv.key = &it->first;
		kv.parentKV = this;

		if ( !isRoot() )
			kv.depth = depth + 1;

		return kv;
	}